

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void gc_obj(Object o)

{
  int in_stack_00000008;
  Instance *ins;
  
  if (in_stack_00000008 == 5) {
    *(int *)o._0_8_ = *(int *)o._0_8_ + -1;
    if ((*(int *)o._0_8_ < 1) && (*(int *)(o._0_8_ + 0x10) == 0)) {
      env_free(*(Environment **)(o._0_8_ + 0x18));
      free((void *)o._0_8_);
    }
  }
  return;
}

Assistant:

void inline gc_obj(Object o){
    if(o.type == OBJECT_INSTANCE){
        Instance *ins = o.instance;
        ins->refCount--;
        if(ins->refCount <= 0 && ins->fromReturn == 0){
            //            printf(debug("[Gc_Obj] Garbage collecting %s#%d!"), ins->name, ins->insCount);
            env_free((Environment *)ins->environment);
            memfree(ins);
        }
    }
}